

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkNullableIndex(CheckerVisitor *this,GetSlotExpr *expr)

{
  bool bVar1;
  
  if (this->effectsOnly == false) {
    bVar1 = isSafeAccess(this,(AccessExpr *)expr);
    if (!bVar1) {
      bVar1 = isPotentiallyNullable(this,(expr->super_SlotAccessExpr)._key);
      if (bVar1) {
        report(this,&((expr->super_SlotAccessExpr)._key)->super_Node,0x41);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkNullableIndex(const GetSlotExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *key = expr->key();

  if (!isSafeAccess(expr) && isPotentiallyNullable(key)) {
    report(expr->key(), DiagnosticsId::DI_POTENTIALLY_NULLABLE_INDEX);
  }
}